

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viterbi.cpp
# Opt level: O2

bool MeCab::Viterbi::buildAlternative(Lattice *lattice)

{
  ushort uVar1;
  ushort uVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ostream *poVar7;
  long *plVar8;
  Node *node;
  long lVar6;
  
  iVar4 = (*lattice->_vptr_Lattice[4])();
  iVar5 = (*lattice->_vptr_Lattice[2])(lattice);
  for (lVar6 = CONCAT44(extraout_var_00,iVar5); lVar6 != 0; lVar6 = *(long *)(lVar6 + 8)) {
    if ((*(byte *)(lVar6 + 0x4f) & 0xfe) != 2) {
      lVar3 = *(long *)(lVar6 + 0x30);
      iVar5 = (*lattice->_vptr_Lattice[8])();
      uVar1 = *(ushort *)(lVar6 + 0x46);
      uVar2 = *(ushort *)(lVar6 + 0x44);
      std::ostream::write((char *)&std::cout,*(long *)(lVar6 + 0x30));
      poVar7 = std::operator<<((ostream *)&std::cout,"\t");
      poVar7 = std::operator<<(poVar7,*(char **)(lVar6 + 0x38));
      std::endl<char,std::char_traits<char>>(poVar7);
      plVar8 = (long *)(CONCAT44(extraout_var,iVar4) +
                        (lVar3 - ((ulong)uVar1 + CONCAT44(extraout_var_01,iVar5))) * 8 +
                       (ulong)uVar2 * 8);
      while (lVar3 = *plVar8, lVar3 != 0) {
        if ((*(short *)(lVar3 + 0x46) == *(short *)(lVar6 + 0x46)) &&
           (*(short *)(lVar3 + 0x44) == *(short *)(lVar6 + 0x44))) {
          std::operator<<((ostream *)&std::cout,"@ ");
          std::ostream::write((char *)&std::cout,*(long *)(lVar3 + 0x30));
          poVar7 = std::operator<<((ostream *)&std::cout,"\t");
          poVar7 = std::operator<<(poVar7,*(char **)(lVar3 + 0x38));
          std::endl<char,std::char_traits<char>>(poVar7);
        }
        plVar8 = (long *)(lVar3 + 0x18);
      }
    }
  }
  poVar7 = std::operator<<((ostream *)&std::cout,"EOS");
  std::endl<char,std::char_traits<char>>(poVar7);
  return true;
}

Assistant:

bool Viterbi::buildAlternative(Lattice *lattice) {
  Node **begin_node_list = lattice->begin_nodes();

  const Node *bos_node = lattice->bos_node();
  for (const Node *node = bos_node; node; node = node->next) {
    if (node->stat == MECAB_BOS_NODE || node->stat == MECAB_EOS_NODE) {
      continue;
    }
    const size_t pos = node->surface - lattice->sentence() -
        node->rlength + node->length;
    std::cout.write(node->surface, node->length);
    std::cout << "\t" << node->feature << std::endl;
    for (const Node *anode = begin_node_list[pos];
         anode; anode = anode->bnext) {
      if (anode->rlength == node->rlength &&
          anode->length == node->length) {
        std::cout << "@ ";
        std::cout.write(anode->surface, anode->length);
        std::cout << "\t" << anode->feature << std::endl;
      }
    }
  }

  std::cout << "EOS" << std::endl;

  return true;
}